

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.h
# Opt level: O2

void __thiscall
StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push
          (StackVector<std::pair<unsigned_long,_unsigned_long>_> *this,
          pair<unsigned_long,_unsigned_long> In)

{
  int iVar1;
  long lVar2;
  value_type local_18;
  
  local_18.second = In.second;
  local_18.first = In.first;
  iVar1 = this->CurSize;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x40) {
    this->Stack[lVar2].first = local_18.first;
    this->Stack[lVar2].second = local_18.second;
  }
  else {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back(&this->Heap,&local_18);
    iVar1 = this->CurSize;
  }
  this->CurSize = iVar1 + 1;
  return;
}

Assistant:

void Push(T In)
	{
		if (CurSize + 1 > STACKVECTOR_SIZE) {
			Heap.push_back(In);
			CurSize++;
		} else {
			Stack[CurSize++] = In;
		}
	}